

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O0

int __thiscall
FastPForLib::VarIntG8IU::encodeBlock
          (VarIntG8IU *this,uint32_t **src,size_t *srclength,uchar **dest,size_t *dstlength)

{
  uint uVar1;
  uint32_t *puVar2;
  byte bVar3;
  int iVar4;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  VarIntG8IU *in_RDI;
  long *in_R8;
  int j;
  uint32_t value;
  int size;
  int i;
  int written;
  int byteNeeded;
  uint32_t *temp;
  int numInt;
  int length;
  int ithSize [8];
  uint32_t buffer [8];
  uchar bitmask;
  uchar desc;
  int local_a0;
  int local_94;
  int local_90;
  int local_80;
  int local_7c;
  int aiStack_78 [8];
  uint32_t auStack_58 [11];
  char local_2a;
  byte local_29;
  long *local_28;
  long *local_20;
  long *local_18;
  long *local_10;
  
  local_29 = 0xff;
  local_2a = '\x01';
  local_7c = 0;
  local_80 = 0;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  while (*local_18 != 0) {
    puVar2 = (uint32_t *)*local_10;
    iVar4 = getNumByteNeeded(in_RDI,*puVar2);
    if (8 < local_7c + iVar4) break;
    bVar3 = local_2a << ((char)iVar4 - 1U & 0x1f);
    local_29 = local_29 ^ bVar3;
    local_2a = bVar3 << 1;
    aiStack_78[local_80] = iVar4;
    local_7c = iVar4 + local_7c;
    auStack_58[local_80] = *puVar2;
    *local_10 = *local_10 + 4;
    *local_18 = *local_18 + -4;
    local_80 = local_80 + 1;
  }
  *(byte *)*local_20 = local_29;
  local_90 = 1;
  for (local_94 = 0; local_94 < local_80; local_94 = local_94 + 1) {
    iVar4 = aiStack_78[local_94];
    uVar1 = auStack_58[local_94];
    for (local_a0 = 0; local_a0 < iVar4; local_a0 = local_a0 + 1) {
      *(char *)(*local_20 + (long)local_90) = (char)(uVar1 >> ((byte)(local_a0 << 3) & 0x1f));
      local_90 = local_90 + 1;
    }
  }
  while (local_90 < 9) {
    *(undefined1 *)(*local_20 + (long)local_90) = 0;
    local_90 = local_90 + 1;
  }
  *local_20 = *local_20 + 9;
  *local_28 = *local_28 + -9;
  return 9;
}

Assistant:

int encodeBlock(const uint32_t *&src, size_t &srclength, unsigned char *&dest,
                  size_t &dstlength) {
    unsigned char desc = 0xFF;
    unsigned char bitmask = 0x01;
    uint32_t buffer[8];
    int ithSize[8];
    int length = 0;
    int numInt = 0;

    while (srclength > 0) {
      const uint32_t *temp = src;
      int byteNeeded = getNumByteNeeded(*temp);

      if (PREDICT_FALSE(length + byteNeeded > 8)) {
        break;
      }

      // flip the correct bit in desc
      bitmask = static_cast<unsigned char>(bitmask << (byteNeeded - 1));
      desc = desc ^ bitmask;
      bitmask = static_cast<unsigned char>(bitmask << 1);

      ithSize[numInt] = byteNeeded;
      length += byteNeeded;
      buffer[numInt] = *temp;
      src = src + 1;
      srclength -= 4;
      numInt++;
    }

    dest[0] = desc;
    int written = 1;
    for (int i = 0; i < numInt; i++) {
      int size = ithSize[i];
      uint32_t value = buffer[i];
      for (int j = 0; j < size; j++) {
        dest[written] = static_cast<unsigned char>(value >> (j * 8));
        written++;
      }
    }
    while (written < 9) {
      dest[written++] = 0; // clear padding bytes
    }
    dest += 9;
    dstlength -= 9;
    return 9;
  }